

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  Location pCVar1;
  Value *pVVar2;
  Location pCVar3;
  bool bVar4;
  char *pcVar5;
  _Elt_pointer ppVVar6;
  undefined1 auVar7 [16];
  string decoded_string;
  string local_68;
  ValueHolder local_48;
  ushort local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar4 = decodeString(this,token,&local_68);
  if (bVar4) {
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    pcVar5 = duplicateAndPrefixStringValue
                       (local_68._M_dataplus._M_p,(uint)local_68._M_string_length);
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar6 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = ppVVar6[-1];
    local_40 = *(ushort *)&pVVar2->field_0x8;
    local_48.string_ = *(char **)&pVVar2->value_;
    (pVVar2->value_).string_ = pcVar5;
    *(ushort *)&pVVar2->field_0x8 = local_40 & 0xfe00 | 0x104;
    local_40 = local_40 & 0x1ff;
    ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar6 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar6 = ppVVar6 + -1;
    }
    pVVar2 = *ppVVar6;
    pCVar3 = token->end_;
    pCVar1 = this->begin_;
    auVar7._8_4_ = (int)pCVar1;
    auVar7._0_8_ = pCVar1;
    auVar7._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar2->start_ = (long)token->start_ - (long)pCVar1;
    pVVar2->limit_ = (long)pCVar3 - auVar7._8_8_;
    Value::~Value((Value *)&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool OurReader::decodeString(Token& token) {
  JSONCPP_STRING decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}